

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_go_struct_initializer
          (t_go_generator *this,ostream *out,t_struct *tstruct,bool is_args_or_result)

{
  t_field *tfield;
  bool bVar1;
  ostream *poVar2;
  members_type *this_00;
  reference pptVar3;
  string *name;
  string local_110;
  string local_f0;
  t_const_value *local_d0;
  t_const_value *def_value;
  string publicized_name;
  bool pointer_field;
  t_field *member;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_field_*,_std::allocator<t_field_*>_> *__range1;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  string local_68;
  string local_48;
  byte local_21;
  t_struct *ptStack_20;
  bool is_args_or_result_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  local_21 = is_args_or_result;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  type_name_abi_cxx11_(&local_68,this,&tstruct->super_t_type);
  publicize(&local_48,this,&local_68,(bool)(local_21 & 1));
  poVar2 = std::operator<<(out,(string *)&local_48);
  std::operator<<(poVar2,"{");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  this_00 = t_struct::get_members(ptStack_20);
  __end1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  member = (t_field *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&member);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&__end1);
    tfield = *pptVar3;
    publicized_name.field_2._M_local_buf[0xf] = is_pointer_field(tfield,false);
    std::__cxx11::string::string((string *)&def_value);
    get_publicized_name_and_def_value(this,tfield,(string *)&def_value,&local_d0);
    if (((publicized_name.field_2._M_local_buf[0xf] & 1U) == 0) &&
       (local_d0 != (t_const_value *)0x0)) {
      bVar1 = omit_initialization(tfield);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
        poVar2 = std::operator<<(poVar2,(string *)&local_f0);
        poVar2 = std::operator<<(poVar2,(string *)&def_value);
        poVar2 = std::operator<<(poVar2,": ");
        name = t_field::get_name_abi_cxx11_(tfield);
        render_field_initial_value
                  (&local_110,this,tfield,name,(bool)(publicized_name.field_2._M_local_buf[0xf] & 1)
                  );
        poVar2 = std::operator<<(poVar2,(string *)&local_110);
        poVar2 = std::operator<<(poVar2,",");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_f0);
      }
    }
    std::__cxx11::string::~string((string *)&def_value);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)tstruct_local,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_go_generator::generate_go_struct_initializer(ostream& out,
                                                    t_struct* tstruct,
                                                    bool is_args_or_result) {
  out << publicize(type_name(tstruct), is_args_or_result) << "{";
  const vector<t_field*>& members = tstruct->get_members();
  for (auto member : members) {
    bool pointer_field = is_pointer_field(member);
    string publicized_name;
    t_const_value* def_value;
    get_publicized_name_and_def_value(member, &publicized_name, &def_value);
    if (!pointer_field && def_value != nullptr && !omit_initialization(member)) {
      out << endl << indent() << publicized_name << ": "
          << render_field_initial_value(member, member->get_name(), pointer_field) << ","
          << endl;
    }
  }

  out << "}" << endl;
}